

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::get_string_literal
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view text_,size_t token_start,version ver)

{
  bool bVar1;
  classification cVar2;
  uint32_t *puVar3;
  wchar_t *pwVar4;
  runtime_error *prVar5;
  ulong uVar6;
  size_type sVar7;
  wchar_t *pwVar8;
  type_conflict *ptVar9;
  ostream *poVar10;
  pair<wchar_t,_unsigned_long> pVar11;
  token local_258;
  undefined1 local_229;
  string local_228 [32];
  ostringstream local_208 [8];
  ostringstream oss;
  type *len;
  type *och;
  unsigned_long local_78;
  uint32_t local_70;
  value_type qch;
  wchar_t *local_60;
  size_t token_end;
  undefined1 local_50 [4];
  value_type ch;
  wstring s;
  bool escape;
  version ver_local;
  size_t token_start_local;
  wstring_view text__local;
  
  s.field_2._M_local_buf[3] = (wchar_t)token_start;
  text__local._M_len = text_._M_len;
  s.field_2._M_local_buf[2]._3_1_ = 0;
  token_start_local = (size_t)this;
  text__local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)local_50);
  puVar3 = (uint32_t *)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&token_start_local,
                      (size_type)text_._M_str);
  token_end._4_4_ = *puVar3;
  local_60 = text_._M_str;
  if (token_end._4_4_ != 0x22 && token_end._4_4_ != 0x27) {
    __assert_fail("ch == \'\"\' || ch == \'\\\'\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0xd9,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::get_string_literal(const std::wstring_view, const size_t, version)"
                 );
  }
  do {
    while( true ) {
      local_60 = (wchar_t *)((long)local_60 + 1);
      pwVar8 = local_60;
      pwVar4 = (wchar_t *)
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                          &token_start_local);
      if (pwVar4 <= pwVar8) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Unterminated string");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar3 = (uint32_t *)
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                          &token_start_local,(size_type)local_60);
      local_70 = *puVar3;
      if ((s.field_2._M_local_buf[2]._3_1_ & 1) != 0) break;
      if (local_70 == 0x5c) {
        s.field_2._M_local_buf[2]._3_1_ = 1;
      }
      else {
        if (local_70 == token_end._4_4_) {
          local_60 = (wchar_t *)((long)local_60 + 1);
          token::token(&local_258,string_literal,(wstring *)local_50);
          std::pair<mjs::token,_unsigned_long>::pair<mjs::token,_unsigned_long_&,_true>
                    (__return_storage_ptr__,&local_258,(unsigned_long *)&local_60);
          token::~token(&local_258);
          std::__cxx11::wstring::~wstring((wstring *)local_50);
          return __return_storage_ptr__;
        }
        bVar1 = is_line_terminator(local_70,s.field_2._M_local_buf[3]);
        if (bVar1) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Line terminator in string");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((s.field_2._M_local_buf[3] == L'\x01') && (cVar2 = classify(local_70), cVar2 == format))
        {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"Format control characters not allowed in string literals in ES3");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::wstring::push_back((wchar_t)local_50);
      }
    }
    s.field_2._M_local_buf[2]._3_1_ = 0;
    switch(local_70) {
    case 0x22:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    default:
      bVar1 = is_line_terminator(local_70,s.field_2._M_local_buf[3]);
      if (!bVar1) goto LAB_001d2418;
      if (s.field_2._M_local_buf[3] < L'\x02') {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar5,"Line continuations in string literals not supported until ES5");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      break;
    case 0x27:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
      pVar11 = get_octal_escape_sequence((wstring_view *)&token_start_local,(size_t)local_60);
      local_78 = pVar11.second;
      och._0_4_ = pVar11.first;
      std::get<0ul,wchar_t,unsigned_long>((pair<wchar_t,_unsigned_long> *)&och);
      ptVar9 = std::get<1ul,wchar_t,unsigned_long>((pair<wchar_t,_unsigned_long> *)&och);
      local_60 = (wchar_t *)((*ptVar9 - 1) + (long)local_60);
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x55:
    case 0x75:
      uVar6 = (long)local_60 + 5;
      local_60 = (wchar_t *)((long)local_60 + 1);
      sVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                         &token_start_local);
      if (sVar7 <= uVar6) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Invalid unicode escape sequence");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                          &token_start_local,(size_type)local_60);
      get_hex_value4(pwVar8);
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      local_60 = (wchar_t *)((long)local_60 + 3);
      break;
    case 0x58:
    case 0x78:
      uVar6 = (long)local_60 + 3;
      local_60 = (wchar_t *)((long)local_60 + 1);
      sVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                         &token_start_local);
      if (sVar7 <= uVar6) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Invalid hex escape sequence");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pwVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                          &token_start_local,(size_type)local_60);
      get_hex_value2(pwVar8);
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      local_60 = (wchar_t *)((long)local_60 + 1);
      break;
    case 0x5c:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x62:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x66:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x6e:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x72:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x74:
      std::__cxx11::wstring::push_back((wchar_t)local_50);
      break;
    case 0x76:
      if (s.field_2._M_local_buf[3] == L'\0') {
LAB_001d2418:
        std::__cxx11::ostringstream::ostringstream(local_208);
        poVar10 = std::operator<<((ostream *)local_208,"Unhandled escape sequence: \\");
        std::operator<<(poVar10,(char)local_70);
        local_229 = 1;
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar5,local_228);
        local_229 = 0;
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::wstring::push_back((wchar_t)local_50);
    }
  } while( true );
}

Assistant:

std::pair<token, size_t> get_string_literal(const std::wstring_view text_, const size_t token_start, version ver) {
    bool escape = false;
    std::wstring s;
    const auto ch = text_[token_start];
    assert(ch == '"' || ch == '\'');
    size_t token_end = token_start + 1;
    for ( ;; ++token_end) {
        if (token_end >= text_.size()) {
            throw std::runtime_error("Unterminated string");
        }
        const auto qch = text_[token_end];
        if (escape) {
            escape = false;
            switch (qch) {
            case '\'': s.push_back('\''); break;
            case '\"': s.push_back('\"'); break;
            case '\\': s.push_back('\\'); break;
            case 'b': s.push_back('\b'); break;
            case 'f': s.push_back('\f'); break;
            case 'n': s.push_back('\n'); break;
            case 'r': s.push_back('\r'); break;
            case 't': s.push_back('\t'); break;
            case 'v':
                // '\v' only support in ES3 onwards
                if (ver == version::es1) {
                    goto invalid_escape_sequence;
                }
                s.push_back('\v');
                break;
                // HexEscapeSeqeunce
            case 'x': case 'X':
                ++token_end;
                if (token_end + 2 >= text_.size()) {
                    throw std::runtime_error("Invalid hex escape sequence");
                }
                s.push_back(static_cast<wchar_t>(get_hex_value2(&text_[token_end])));
                token_end += 1; // Incremented in loop
                break;
                // OctalEscapeSequence
            case '0': case '1': case '2': case '3':
            case '4': case '5': case '6': case '7':
                {
                    const auto [och, len] =  get_octal_escape_sequence(text_, token_end);
                    token_end += len-1; // Incremented in loop
                    s.push_back(static_cast<wchar_t>(och));
                    break;
                }
                break;
                // UnicodeEscapeSequence
            case 'u': case 'U':
                ++token_end;
                if (token_end + 4 >= text_.size()) {
                    throw std::runtime_error("Invalid unicode escape sequence");
                }
                s.push_back(static_cast<wchar_t>(get_hex_value4(&text_[token_end])));
                token_end += 3; // Incremented in loop
                break;
            default:
                if (is_line_terminator(qch, ver)) {
                    if (ver >= version::es5) {
                        // OK, line continuation
                        break;
                    }
                    throw std::runtime_error("Line continuations in string literals not supported until ES5");
                }
            invalid_escape_sequence:
                std::ostringstream oss;
                oss << "Unhandled escape sequence: \\" << (char)qch;
                throw std::runtime_error(oss.str());
            }
        } else if (qch == '\\') {
            escape = true;
        } else if (qch == ch) {
            ++token_end;
            break;
        } else if (is_line_terminator(qch, ver)) {
            throw std::runtime_error("Line terminator in string");
        } else {        
            if (ver == version::es3 && classify(qch) == unicode::classification::format) {
                throw std::runtime_error("Format control characters not allowed in string literals in ES3");
            }
            s.push_back(qch);
        }
    }

    return { token{token_type::string_literal, std::move(s)}, token_end };
}